

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void add_new_tile(vector<Tile_*,_std::allocator<Tile_*>_> *tiles,Tile *tile)

{
  Tile *local_8;
  
  tile->id = (uint16_t)
             ((uint)(*(int *)&(tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                    *(int *)&(tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_8 = tile;
  std::vector<Tile_*,_std::allocator<Tile_*>_>::push_back(tiles,&local_8);
  return;
}

Assistant:

void add_new_tile(std::vector<Tile *> *tiles, Tile *tile) {
    tile->id = tiles->size();
    tiles->push_back(tile);
}